

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O3

wchar_t rd_dungeon_aux(chunk **c)

{
  chunk **ppcVar1;
  int iVar2;
  chunk *c_00;
  char *pcVar3;
  loc grid;
  player *extraout_RAX;
  connector *pcVar4;
  bitflag *pbVar5;
  player *extraout_RAX_00;
  player *ppVar6;
  byte bVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  ulong uVar11;
  uint8_t tmp8u;
  uint8_t count;
  uint16_t tmp16u;
  uint16_t width;
  uint16_t height;
  char name [100];
  byte local_a8;
  byte local_a7;
  uint16_t local_a6;
  ushort local_a4;
  ushort local_a2;
  chunk **local_a0;
  int local_98;
  short local_94;
  
  rd_string((char *)&local_98,100);
  if ((local_94 == 0x61 && local_98 == 0x6e657261) && (*c == (chunk *)cave)) {
    player->upkeep->arena_level = true;
  }
  rd_u16b(&local_a2);
  rd_u16b(&local_a4);
  c_00 = (chunk *)cave_new((uint)local_a2,(uint)local_a4);
  pcVar3 = string_make((char *)&local_98);
  c_00->name = pcVar3;
  local_a0 = c;
  if (square_size == '\0') {
    wVar10 = c_00->height;
  }
  else {
    wVar10 = c_00->height;
    uVar11 = 0;
    bVar7 = square_size;
    do {
      if (L'\0' < wVar10) {
        wVar8 = L'\0';
        wVar9 = L'\0';
        do {
          rd_byte(&local_a7);
          rd_byte(&local_a8);
          if (local_a7 != 0) {
            iVar2 = local_a7 + 1;
            do {
              c_00->squares[wVar9][wVar8].info[uVar11] = local_a8;
              wVar8 = wVar8 + L'\x01';
              if (c_00->width <= wVar8) {
                wVar9 = wVar9 + L'\x01';
                wVar8 = L'\0';
                if (c_00->height <= wVar9) break;
              }
              iVar2 = iVar2 + -1;
            } while (1 < iVar2);
          }
          wVar10 = c_00->height;
          bVar7 = square_size;
        } while (wVar9 < wVar10);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < bVar7);
  }
  if (L'\0' < wVar10) {
    wVar10 = L'\0';
    wVar8 = L'\0';
    do {
      rd_byte(&local_a7);
      rd_byte(&local_a8);
      if (local_a7 != 0) {
        iVar2 = local_a7 + 1;
        do {
          grid = (loc)loc(wVar10,wVar8);
          square_set_feat((chunk_conflict *)c_00,grid,(uint)local_a8);
          wVar10 = wVar10 + L'\x01';
          if (c_00->width <= wVar10) {
            wVar8 = wVar8 + L'\x01';
            wVar10 = L'\0';
            if (c_00->height <= wVar8) break;
          }
          iVar2 = iVar2 + -1;
        } while (1 < iVar2);
      }
    } while (wVar8 < c_00->height);
  }
  rd_byte(&local_a8);
  c_00->feeling = local_a8;
  rd_u16b(&local_a6);
  c_00->feeling_squares = local_a6;
  rd_s32b(&c_00->turn);
  ppcVar1 = local_a0;
  ppVar6 = player;
  if ((player->opts).opt[0x2b] == true) {
    rd_byte(&local_a8);
    ppVar6 = extraout_RAX;
    while (local_a8 != 0xff) {
      pcVar4 = (connector *)mem_zalloc(0x20);
      pbVar5 = (bitflag *)mem_zalloc((ulong)square_size);
      pcVar4->info = pbVar5;
      (pcVar4->grid).x = (uint)local_a8;
      rd_byte(&local_a8);
      (pcVar4->grid).y = (uint)local_a8;
      rd_byte(&pcVar4->feat);
      if (square_size != '\0') {
        uVar11 = 0;
        do {
          rd_byte(pcVar4->info + uVar11);
          uVar11 = uVar11 + 1;
        } while (uVar11 < square_size);
      }
      pcVar4->next = c_00->join;
      c_00->join = pcVar4;
      rd_byte(&local_a8);
      ppVar6 = extraout_RAX_00;
    }
  }
  *ppcVar1 = c_00;
  return (wchar_t)ppVar6;
}

Assistant:

static int rd_dungeon_aux(struct chunk **c)
{
	struct chunk *c1;
	int i, n, y, x;

	uint16_t height, width;

	uint8_t count;
	uint8_t tmp8u;
	uint16_t tmp16u;
	char name[100];

	/* Header info */
	rd_string(name, sizeof(name));
	if (streq(name, "arena") && (*c == cave)) {
		player->upkeep->arena_level = true;
	}
	rd_u16b(&height);
	rd_u16b(&width);

	/* We need a cave struct */
	c1 = cave_new(height, width);
	c1->name = string_make(name);

    /* Run length decoding of cave->squares[y][x].info */
	for (n = 0; n < square_size; n++) {
		/* Load the dungeon data */
		for (x = y = 0; y < c1->height; ) {
			/* Grab RLE info */
			rd_byte(&count);
			rd_byte(&tmp8u);

			/* Apply the RLE info */
			for (i = count; i > 0; i--) {
				/* Extract "info" */
				c1->squares[y][x].info[n] = tmp8u;

				/* Advance/Wrap */
				if (++x >= c1->width) {
					/* Wrap */
					x = 0;

					/* Advance/Wrap */
					if (++y >= c1->height) break;
				}
			}
		}
	}

	/* Run length decoding of dungeon data */
	for (x = y = 0; y < c1->height; ) {
		/* Grab RLE info */
		rd_byte(&count);
		rd_byte(&tmp8u);

		/* Apply the RLE info */
		for (i = count; i > 0; i--) {
			/* Extract "feat" */
			square_set_feat(c1, loc(x, y), tmp8u);

			/* Advance/Wrap */
			if (++x >= c1->width) {
				/* Wrap */
				x = 0;

				/* Advance/Wrap */
				if (++y >= c1->height) break;
			}
		}
	}


	/* Read "feeling" */
	rd_byte(&tmp8u);
	c1->feeling = tmp8u;
	rd_u16b(&tmp16u);
	c1->feeling_squares = tmp16u;
	rd_s32b(&c1->turn);

	/* Read connector info */
	if (OPT(player, birth_levels_persist)) {
		rd_byte(&tmp8u);
		while (tmp8u != 0xff) {
			struct connector *current = mem_zalloc(sizeof *current);
			current->info = mem_zalloc(square_size * sizeof(bitflag));
			current->grid.x = tmp8u;
			rd_byte(&tmp8u);
			current->grid.y = tmp8u;
			rd_byte(&current->feat);
			for (n = 0; n < square_size; n++) {
				rd_byte(&current->info[n]);
			}
			current->next = c1->join;
			c1->join = current;
			rd_byte(&tmp8u);
		}
	}

	/* Assign */
	*c = c1;

	return 0;
}